

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CadicalInterfacing.cpp
# Opt level: O0

void __thiscall
SAT::CadicalInterfacing::collectZeroImplied(CadicalInterfacing *this,SATLiteralStack *acc)

{
  int iVar1;
  int val;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 in_stack_ffffffffffffffc4;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 local_14;
  
  for (local_14._content = 1;
      iVar1 = CaDiCaL::Solver::vars
                        ((Solver *)
                         CONCAT44(in_stack_ffffffffffffffc4._content,in_stack_ffffffffffffffc0)),
      (int)local_14._content <= iVar1; local_14._content = local_14._content + 1) {
    iVar1 = CaDiCaL::Solver::fixed
                      ((Solver *)
                       CONCAT44(in_stack_ffffffffffffffc4._content,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc4 = local_14;
      if (iVar1 < 1) {
        in_stack_ffffffffffffffc4._content = -local_14._content;
      }
      cadical2Vampire(0xa9a339);
      Lib::Stack<SAT::SATLiteral>::push
                ((Stack<SAT::SATLiteral> *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (SATLiteral)in_stack_ffffffffffffffc4.field_1);
    }
  }
  return;
}

Assistant:

void CadicalInterfacing::collectZeroImplied(SATLiteralStack& acc)
{
  for(int i = 1, val; i <= _solver.vars(); i++)
    if((val = _solver.fixed(i)))
      acc.push(cadical2Vampire(val > 0 ? i : -i));
}